

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O0

TermList ApplicativeHelper::createAppTerm(TermList sort,TermList head,TermStack *terms)

{
  TermList arg1;
  size_t sVar1;
  TermList arg2;
  Stack<Kernel::TermList> *in_RDX;
  uint64_t in_RSI;
  uint64_t in_RDI;
  int i;
  TermList s2;
  TermList s1;
  TermList res;
  TermList in_stack_ffffffffffffff78;
  undefined1 shared;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  TermList s1_00;
  undefined8 local_10;
  uint64_t local_8;
  
  Kernel::TermList::TermList((TermList *)&stack0xffffffffffffffd8);
  Kernel::TermList::TermList((TermList *)&stack0xffffffffffffffd0);
  sVar1 = Lib::Stack<Kernel::TermList>::size(in_RDX);
  iVar2 = (int)sVar1;
  local_10 = in_RDI;
  local_8 = in_RSI;
  while (iVar2 = iVar2 + -1, -1 < iVar2) {
    shared = local_10._7_1_;
    arg2 = getNthArg(in_stack_ffffffffffffff78,0);
    s1_00 = arg2;
    local_10 = getResultApplieadToNArgs(in_stack_ffffffffffffff78,0);
    Lib::Stack<Kernel::TermList>::operator[](in_RDX,(long)iVar2);
    arg1._content._4_4_ = iVar2;
    arg1._content._0_4_ = in_stack_ffffffffffffffc8;
    local_8 = (uint64_t)createAppTerm(s1_00,local_10,arg1,arg2,(bool)shared);
  }
  return (TermList)local_8;
}

Assistant:

TermList ApplicativeHelper::createAppTerm(TermList sort, TermList head, TermStack& terms)
{
  ASS(head.isVar() || SortHelper::getResultSort(head.term()) == sort);

  TermList res = head;
  TermList s1, s2;
  
  for(int i = terms.size() - 1; i >= 0; i--){
    s1 = getNthArg(sort, 1);
    s2 = getResultApplieadToNArgs(sort, 1);
    res = createAppTerm(s1, s2, res, terms[i]);
    sort = s2;
  }
  return res; 

}